

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSFunctionBytecode * JS_GetFunctionBytecode(JSValue val)

{
  BOOL BVar1;
  int in_ESI;
  long in_RDI;
  JSObject *p;
  undefined8 local_8;
  
  if (in_ESI == -1) {
    BVar1 = js_class_has_bytecode((uint)*(ushort *)(in_RDI + 6));
    if (BVar1 == 0) {
      local_8 = (JSFunctionBytecode *)0x0;
    }
    else {
      local_8 = *(JSFunctionBytecode **)(in_RDI + 0x30);
    }
  }
  else {
    local_8 = (JSFunctionBytecode *)0x0;
  }
  return local_8;
}

Assistant:

static JSFunctionBytecode *JS_GetFunctionBytecode(JSValueConst val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return NULL;
    p = JS_VALUE_GET_OBJ(val);
    if (!js_class_has_bytecode(p->class_id))
        return NULL;
    return p->u.func.function_bytecode;
}